

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O0

void pnga_add_constant(Integer g_a,void *alpha)

{
  Integer hi [7];
  Integer lo [7];
  Integer ndim;
  Integer type;
  Integer *in_stack_00000178;
  Integer *in_stack_00000180;
  Integer *in_stack_00000188;
  Integer in_stack_00000190;
  Integer in_stack_00000400;
  void *in_stack_00000408;
  Integer *in_stack_00000410;
  Integer *in_stack_00000418;
  Integer in_stack_00000420;
  undefined8 local_58 [7];
  long local_20;
  
  pnga_inquire(in_stack_00000190,in_stack_00000188,in_stack_00000180,in_stack_00000178);
  for (; local_20 != 0; local_20 = local_20 + -1) {
    local_58[local_20 + -1] = 1;
  }
  _ga_sync_begin = 1;
  gai_oper_elem(in_stack_00000420,in_stack_00000418,in_stack_00000410,in_stack_00000408,
                in_stack_00000400);
  return;
}

Assistant:

void pnga_add_constant(Integer g_a, void *alpha)
{
   Integer type, ndim;
   Integer lo[MAXDIM],hi[MAXDIM];

    pnga_inquire(g_a,  &type, &ndim, hi);
    while(ndim){
        lo[ndim-1]=1;
        ndim--;
    }
    _ga_sync_begin = 1; /*just to be on the safe side*/
    gai_oper_elem(g_a, lo, hi, alpha, OP_ADD_CONST);
}